

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::export_class_to_library
          (t_dart_generator *this,string *file_name,string *class_name)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_40 [8];
  string subdir;
  string *class_name_local;
  string *file_name_local;
  t_dart_generator *this_local;
  
  subdir.field_2._8_8_ = class_name;
  std::__cxx11::string::string((string *)local_40);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_40,(string *)&this->library_name_);
  }
  else {
    std::__cxx11::string::operator=((string *)local_40,"src");
  }
  std::operator+(&local_130,"export \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::operator+(&local_110,&local_130,"/");
  std::operator+(&local_f0,&local_110,file_name);
  std::operator+(&local_d0,&local_f0,".dart\' show ");
  std::operator+(&local_b0,&local_d0,class_name);
  std::operator+(&local_90,&local_b0,";");
  std::operator+(&local_70,&local_90,&::endl_abi_cxx11_);
  std::__cxx11::string::operator+=((string *)&this->library_exports_,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void t_dart_generator::export_class_to_library(string file_name, string class_name) {
  string subdir;
  if (library_prefix_.empty()) {
    subdir = "src";
  } else {
    subdir = library_name_;
  }
  library_exports_ += "export '" + subdir + "/" + file_name + ".dart' show " + class_name + ";" + endl;
}